

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cpp
# Opt level: O0

void __thiscall EOPlus::Parser_Token_Server_Base::PutBack(Parser_Token_Server_Base *this,Token *t)

{
  int iVar1;
  variant local_a8;
  Token local_68;
  Token *local_18;
  Token *t_local;
  Parser_Token_Server_Base *this_local;
  
  local_18 = t;
  t_local = (Token *)this;
  Token::operator=(&this->reject_token,t);
  this->reject_line = this->line;
  this->line = this->line - t->newlines;
  if (t->type == NewLine) {
    this->line = this->line + -1;
  }
  while (iVar1 = t->newlines, t->newlines = iVar1 + -1, 0 < iVar1) {
    util::variant::variant(&local_a8);
    Token::Token(&local_68,NewLine,&local_a8);
    std::stack<EOPlus::Token,_std::deque<EOPlus::Token,_std::allocator<EOPlus::Token>_>_>::push
              (&this->token_buffer,&local_68);
    Token::~Token(&local_68);
    util::variant::~variant(&local_a8);
  }
  std::stack<EOPlus::Token,_std::deque<EOPlus::Token,_std::allocator<EOPlus::Token>_>_>::push
            (&this->token_buffer,t);
  return;
}

Assistant:

void Parser_Token_Server_Base::PutBack(Token t)
	{
		this->reject_token = t;
		this->reject_line = this->line;
		this->line -= t.newlines;

		if (t.type == Token::NewLine)
			--this->line;

		while (t.newlines-- > 0)
			this->token_buffer.push(Token(Token::NewLine));

		this->token_buffer.push(t);
	}